

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multi.c
# Opt level: O2

CURLMcode Curl_multi_add_perform(Curl_multi *multi,Curl_easy *data,connectdata *conn)

{
  int *piVar1;
  CURLMcode CVar2;
  
  if (multi->in_callback == false) {
    CVar2 = curl_multi_add_handle(multi,data);
    if (CVar2 == CURLM_OK) {
      CVar2 = CURLM_OK;
      Curl_init_do(data,(connectdata *)0x0);
      if (data->mstate != CURLM_STATE_PERFORM) {
        data->mstate = CURLM_STATE_PERFORM;
      }
      Curl_attach_connnection(data,conn);
      piVar1 = &(data->req).keepon;
      *(byte *)piVar1 = (byte)*piVar1 | 1;
    }
  }
  else {
    CVar2 = CURLM_RECURSIVE_API_CALL;
  }
  return CVar2;
}

Assistant:

CURLMcode Curl_multi_add_perform(struct Curl_multi *multi,
                                 struct Curl_easy *data,
                                 struct connectdata *conn)
{
  CURLMcode rc;

  if(multi->in_callback)
    return CURLM_RECURSIVE_API_CALL;

  rc = curl_multi_add_handle(multi, data);
  if(!rc) {
    struct SingleRequest *k = &data->req;

    /* pass in NULL for 'conn' here since we don't want to init the
       connection, only this transfer */
    Curl_init_do(data, NULL);

    /* take this handle to the perform state right away */
    multistate(data, CURLM_STATE_PERFORM);
    Curl_attach_connnection(data, conn);
    k->keepon |= KEEP_RECV; /* setup to receive! */
  }
  return rc;
}